

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O0

bool __thiscall asl::Var::operator_cast_to_bool(Var *this)

{
  int iVar1;
  Array<char> *this_00;
  Var *this_local;
  
  switch(this->_type) {
  case NUL:
    this_local._7_1_ = false;
    break;
  case NUMBER:
  case FLOAT:
    this_local._7_1_ = (this->field_1)._d != 0.0;
    break;
  case BOOL:
    this_local._7_1_ = (bool)((this->field_1)._a._space[0] & 1);
    break;
  case INT:
    this_local._7_1_ = (this->field_1)._i != 0;
    break;
  case SSTRING:
    this_local._7_1_ = (this->field_1)._b != false;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case STRING:
    this_00 = StaticSpace<asl::Array<char>_>::operator->(&(this->field_1)._s);
    iVar1 = Array<char>::length(this_00);
    this_local._7_1_ = 1 < iVar1;
    break;
  case ARRAY:
  case DIC:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

Var::operator bool() const
{
	switch (_type) {
	case BOOL:
		return _b;
	case INT:
		return _i != 0;
	case NUMBER:
	case FLOAT:
		return _d != 0;
	case ARRAY:
	case OBJ:
		return true;
	case STRING:
		return _s->length() > 1;
	case SSTRING:
		return _ss[0] != 0;
	case NUL:
		return false;
	default: return false;
	}
}